

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O3

int __thiscall unixsocketipc::MessageReceiver::listen(MessageReceiver *this,int __fd,int __n)

{
  bool bVar1;
  int client_socket_fd;
  int iVar2;
  undefined8 unaff_RBP;
  uint remote_length;
  sockaddr_un remote;
  socklen_t local_a4;
  sockaddr local_9e [6];
  
  if (this->server_socket_fd == 0) {
    iVar2 = 0;
  }
  else {
    ::listen(this->server_socket_fd,1);
    local_a4 = 0x6e;
    do {
      client_socket_fd = accept(this->server_socket_fd,local_9e,&local_a4);
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),client_socket_fd != -1);
      iVar2 = (int)unaff_RBP;
      if (client_socket_fd == -1) {
        return iVar2;
      }
      if ((this->on_client_connected).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->on_client_connected)._M_invoker)((_Any_data *)&this->on_client_connected);
      }
      bVar1 = handle_next_client(this,client_socket_fd);
      close(client_socket_fd);
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

bool MessageReceiver::listen() {
   if (!server_socket_fd) {
      DEBUG_MSG("%s: not initialized\n", __FUNCTION__);
      return false;
   }

   // mark socket as listening socket
   ::listen(server_socket_fd, 1); // 1 is max size of waiting connections queue, more connection will be rejected

   sockaddr_un remote;
   unsigned remote_length = sizeof(remote);

   // listen for incoming connections
   bool keep_working = true;
   while (keep_working) {
       DEBUG_MSG("%s: listening for incoming connection...\n", __FUNCTION__);

       // 1. accept new client socket
       int client_socket_fd = accept(server_socket_fd, (sockaddr*)&remote, &remote_length); // remote is filled with remote config
       if (client_socket_fd == -1) {
          DEBUG_MSG("%s: accept failed\n", __FUNCTION__);
          return false;
       }

       // 2. notify about new client connected
       if (on_client_connected)
           on_client_connected();

       // 3. handle the client
       keep_working = handle_next_client(client_socket_fd);

       // 4. communication done. Close the client socket
      ::close(client_socket_fd);
   }

   DEBUG_MSG("%s: listening done\n", __FUNCTION__);
   return true;
}